

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O0

array<unsigned_long,_8UL> * __thiscall
Omega_h::Overlay::get_cell_nodes
          (array<unsigned_long,_8UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  int iVar1;
  reference pvVar2;
  ulong local_a0;
  size_t i;
  Adj local_88;
  undefined1 local_58 [8];
  LOs cells2nodes;
  size_t cell_local;
  Overlay *this_local;
  
  cells2nodes.write_.shared_alloc_.direct_ptr = (void *)cell;
  Omega_h::Mesh::get_adj(&local_88,&this->mesh,3,0);
  Read<int>::Read((Read<int> *)local_58,&local_88.super_Graph.ab2b);
  Adj::~Adj(&local_88);
  for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
    iVar1 = *(int *)((long)&(cells2nodes.write_.shared_alloc_.alloc)->size +
                    (long)((int)((long)cells2nodes.write_.shared_alloc_.direct_ptr << 3) +
                          (int)local_a0) * 4);
    pvVar2 = std::array<unsigned_long,_8UL>::operator[](__return_storage_ptr__,local_a0);
    *pvVar2 = (long)iVar1;
  }
  Read<int>::~Read((Read<int> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 8> Overlay::get_cell_nodes(size_t cell) const {
  std::array<size_t, 8> nodes;
  auto cells2nodes = mesh.get_adj(REGION, VERT).ab2b;
  for (size_t i = 0; i < 8; ++i) {
    nodes[i] = size_t(cells2nodes[LO(cell * 8 + i)]);
  }
  return nodes;
}